

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void openpipe(int output_id,string *pipe,FILE **fout)

{
  FILE *__stream;
  bool bVar1;
  char *__filename;
  FILE *pFVar2;
  undefined8 uVar3;
  FILE *f;
  FILE **fout_local;
  string *pipe_local;
  int output_id_local;
  
  bVar1 = std::operator==(pipe,"-");
  if (bVar1) {
    fout[output_id] = _stdout;
  }
  else {
    __filename = (char *)std::__cxx11::string::c_str();
    pFVar2 = fopen(__filename,"wb");
    __stream = _stderr;
    if (pFVar2 == (FILE *)0x0) {
      uVar3 = std::__cxx11::string::c_str();
      fprintf(__stream,"FATAL: Cannot open %s for output\n",uVar3);
      exit(1);
    }
    fout[output_id] = (FILE *)pFVar2;
  }
  return;
}

Assistant:

void openpipe(int output_id, const std::string& pipe, FILE** fout)
{
	if (pipe == "-") {
		fout[output_id] = stdout;
	} else {
		FILE * f = fopen(pipe.c_str(), "wb");
		if (f != nullptr) {
			fout[output_id] = f;
		} else {
			fprintf(stderr, "FATAL: Cannot open %s for output\n",
				pipe.c_str());
			exit(EXIT_FAILURE);
		}
	}
}